

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strftime.cpp
# Opt level: O2

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::StrfTimeBindFunction<true>
          (duckdb *this,ClientContext *context,ScalarFunction *bound_function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments)

{
  int iVar1;
  reference this_00;
  pointer pEVar2;
  type pEVar3;
  ParameterNotResolvedException *this_01;
  InvalidInputException *pIVar4;
  bool is_null;
  allocator local_1c1;
  string error;
  string format_string;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  string local_140;
  Value options_str;
  StrfTimeFormat format;
  
  this_00 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
            ::get<true>(arguments,0);
  pEVar2 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (this_00);
  iVar1 = (*(pEVar2->super_BaseExpression)._vptr_BaseExpression[6])(pEVar2);
  if ((char)iVar1 != '\0') {
    this_01 = (ParameterNotResolvedException *)__cxa_allocate_exception(0x10);
    ParameterNotResolvedException::ParameterNotResolvedException(this_01);
    __cxa_throw(this_01,&ParameterNotResolvedException::typeinfo,
                ::std::runtime_error::~runtime_error);
  }
  pEVar2 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (this_00);
  iVar1 = (*(pEVar2->super_BaseExpression)._vptr_BaseExpression[0xf])(pEVar2);
  if ((char)iVar1 != '\0') {
    pEVar3 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator*(this_00);
    ExpressionExecutor::EvaluateScalar(&options_str,context,pEVar3,false);
    Value::GetValue<std::__cxx11::string>(&format_string,&options_str);
    format.super_StrTimeFormat.format_specifier._M_dataplus._M_p =
         (pointer)&format.super_StrTimeFormat.format_specifier.field_2;
    format.super_StrTimeFormat.format_specifier._M_string_length = 0;
    format.super_StrTimeFormat.format_specifier.field_2._M_local_buf[0] = '\0';
    format.super_StrTimeFormat.specifiers.
    super_vector<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_>.
    super__Vector_base<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    format.super_StrTimeFormat.specifiers.
    super_vector<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_>.
    super__Vector_base<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    format.super_StrTimeFormat.specifiers.
    super_vector<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_>.
    super__Vector_base<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    format.super_StrTimeFormat.literals.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    format.super_StrTimeFormat.literals.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    format.super_StrTimeFormat.literals.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    format.super_StrTimeFormat.constant_size = 0;
    format.super_StrTimeFormat.numeric_width.super_vector<int,_std::allocator<int>_>.
    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)0x0;
    format.super_StrTimeFormat.numeric_width.super_vector<int,_std::allocator<int>_>.
    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
         (pointer)0x0;
    format.super_StrTimeFormat.numeric_width.super_vector<int,_std::allocator<int>_>.
    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_end_of_storage
         = (pointer)0x0;
    format.super_StrTimeFormat._vptr_StrTimeFormat = (_func_int **)&PTR__StrfTimeFormat_027b2098;
    format.is_date_specifier.super_vector<bool,_std::allocator<bool>_>.
    super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    format.is_date_specifier.super_vector<bool,_std::allocator<bool>_>.
    super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_offset = 0;
    format.is_date_specifier.super_vector<bool,_std::allocator<bool>_>.
    super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_end_of_storage =
         (_Bit_pointer)0x0;
    format.var_length_specifiers.
    super_vector<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_>.
    super__Vector_base<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    format.var_length_specifiers.
    super_vector<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_>.
    super__Vector_base<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    format.is_date_specifier.super_vector<bool,_std::allocator<bool>_>.
    super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_offset = 0;
    format.var_length_specifiers.
    super_vector<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_>.
    super__Vector_base<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    format.is_date_specifier.super_vector<bool,_std::allocator<bool>_>.
    super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    is_null = options_str.is_null;
    if (options_str.is_null == false) {
      StrTimeFormat::ParseFormatSpecifier(&error,&format_string,&format.super_StrTimeFormat);
      if (error._M_string_length != 0) {
        pIVar4 = (InvalidInputException *)__cxa_allocate_exception(0x10);
        pEVar3 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                 operator*(this_00);
        ::std::__cxx11::string::string
                  ((string *)&local_140,"Failed to parse format specifier %s: %s",&local_1c1);
        ::std::__cxx11::string::string((string *)&local_160,(string *)&format_string);
        ::std::__cxx11::string::string((string *)&local_180,(string *)&error);
        InvalidInputException::InvalidInputException<std::__cxx11::string,std::__cxx11::string>
                  (pIVar4,pEVar3,&local_140,&local_160,&local_180);
        __cxa_throw(pIVar4,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
      }
      ::std::__cxx11::string::~string((string *)&error);
    }
    make_uniq<duckdb::StrfTimeBindData,duckdb::StrfTimeFormat&,std::__cxx11::string&,bool&>
              ((duckdb *)&error,&format,&format_string,&is_null);
    *(pointer *)this = error._M_dataplus._M_p;
    StrfTimeFormat::~StrfTimeFormat(&format);
    ::std::__cxx11::string::~string((string *)&format_string);
    Value::~Value(&options_str);
    return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
           (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)this;
  }
  pIVar4 = (InvalidInputException *)__cxa_allocate_exception(0x10);
  pEVar3 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator*
                     (this_00);
  ::std::__cxx11::string::string
            ((string *)&format,"strftime format must be a constant",(allocator *)&options_str);
  InvalidInputException::InvalidInputException<>(pIVar4,pEVar3,(string *)&format);
  __cxa_throw(pIVar4,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static unique_ptr<FunctionData> StrfTimeBindFunction(ClientContext &context, ScalarFunction &bound_function,
                                                     vector<unique_ptr<Expression>> &arguments) {
	auto format_idx = REVERSED ? 0U : 1U;
	auto &format_arg = arguments[format_idx];
	if (format_arg->HasParameter()) {
		throw ParameterNotResolvedException();
	}
	if (!format_arg->IsFoldable()) {
		throw InvalidInputException(*format_arg, "strftime format must be a constant");
	}
	Value options_str = ExpressionExecutor::EvaluateScalar(context, *format_arg);
	auto format_string = options_str.GetValue<string>();
	StrfTimeFormat format;
	bool is_null = options_str.IsNull();
	if (!is_null) {
		string error = StrTimeFormat::ParseFormatSpecifier(format_string, format);
		if (!error.empty()) {
			throw InvalidInputException(*format_arg, "Failed to parse format specifier %s: %s", format_string, error);
		}
	}
	return make_uniq<StrfTimeBindData>(format, format_string, is_null);
}